

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> __thiscall
cs_impl::
cni_helper<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
::_call<0>(cni_helper<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> sVar1;
  var *in_stack_000000e0;
  element_type *this_00;
  element_type *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0UL>
  ::convert(in_stack_000000e0);
  std::
  function<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  ::operator()((function<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                *)in_stack_ffffffffffffffd8._M_pi,
               (shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffffd0);
  type_convertor<std::shared_ptr<std::ostream>,std::shared_ptr<std::ostream>>::
  convert<std::shared_ptr<std::ostream>>
            ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)
             &stack0xffffffffffffffd0);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::shared_ptr
            ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)this_00,in_RSI);
  std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)0x4a4696);
  sVar1.
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>)
         sVar1.
         super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}